

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

utt_res_t * new_utt_res(void)

{
  utt_res_t *puVar1;
  utt_res_t *ur;
  
  puVar1 = (utt_res_t *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                          ,0x73);
  puVar1->uttfile = (char *)0x0;
  puVar1->lmname = (char *)0x0;
  puVar1->fsgname = (char *)0x0;
  puVar1->regmatname = (char *)0x0;
  puVar1->cb2mllrname = (char *)0x0;
  return puVar1;
}

Assistant:

utt_res_t *
new_utt_res()
{
    utt_res_t *ur;
    ur = ckd_calloc(1, sizeof(utt_res_t));
    utt_res_set_uttfile(ur, NULL);
    utt_res_set_lmname(ur, NULL);
    utt_res_set_fsgname(ur, NULL);
    utt_res_set_regmatname(ur, NULL);
    utt_res_set_cb2mllrname(ur, NULL);

    return ur;
}